

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

UString * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::toString_abi_cxx11_
          (UString *__return_storage_ptr__,Interpreter *this,LocationRange *loc)

{
  UString *pUVar1;
  UString *extraout_RAX;
  UString local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_48,L"");
  pUVar1 = anon_unknown_0::Interpreter::manifestJson
                     (__return_storage_ptr__,(Interpreter *)this,loc,false,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
    pUVar1 = extraout_RAX;
  }
  return pUVar1;
}

Assistant:

UString toString(const LocationRange &loc)
    {
        return manifestJson(loc, false, U"");
    }